

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O0

void __thiscall
PrimitiveObjectsWriter::WriteLiteralString
          (PrimitiveObjectsWriter *this,string *inString,ETokenSeparator inSeparate)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  Byte aValue;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  Byte buffer [5];
  ETokenSeparator inSeparate_local;
  string *inString_local;
  PrimitiveObjectsWriter *this_local;
  
  if (this->mStreamForWriting != (IByteWriter *)0x0) {
    (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,"(",1);
    local_30._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      _Stack_38._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
      if (!bVar2) break;
      pbVar3 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_30);
      bVar1 = *pbVar3;
      if (((bVar1 == 0x28) || (bVar1 == 0x29)) || (bVar1 == 0x5c)) {
        it._M_current._7_1_ = 0x5c;
        (*this->mStreamForWriting->_vptr_IByteWriter[2])
                  (this->mStreamForWriting,(undefined1 *)((long)&it._M_current + 7),2);
      }
      else if ((bVar1 < 0x20) || (0x7e < bVar1)) {
        sprintf((char *)((long)&it._M_current + 7),"\\%03o",(ulong)bVar1);
        (*this->mStreamForWriting->_vptr_IByteWriter[2])
                  (this->mStreamForWriting,(undefined1 *)((long)&it._M_current + 7),4);
      }
      else {
        it._M_current._7_1_ = bVar1;
        (*this->mStreamForWriting->_vptr_IByteWriter[2])
                  (this->mStreamForWriting,(undefined1 *)((long)&it._M_current + 7),1);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_30);
    }
    (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,")",1);
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteLiteralString(const std::string& inString,ETokenSeparator inSeparate)
{
	if(!mStreamForWriting)
		return;
	mStreamForWriting->Write(scLeftParanthesis,1);
	// doing some string conversion, so that charachters are written as safe ones.
	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inString.begin();
	for(;it != inString.end();++it)
	{
		Byte aValue = *it;
		if(aValue == '(' || aValue == ')' || aValue == '\\')
		{
			buffer[0] = '\\';
			buffer[1] = aValue;
			mStreamForWriting->Write(buffer,2);
		}
		else if (aValue < 32 || aValue > 126) // grabbing all nonprintable chars
		{
			SAFE_SPRINTF_1((char*)buffer,5,"\\%03o",aValue); 
			mStreamForWriting->Write(buffer,4);		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
		
	}
	mStreamForWriting->Write(scRightParanthesis,1);
	WriteTokenSeparator(inSeparate);
}